

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

longlong cmsys::SystemInformationImplementation::GetCyclesDifference
                   (DELAY_FUNC DelayFunction,uint uiParameter)

{
  uint uiParameter_local;
  DELAY_FUNC DelayFunction_local;
  
  return -1;
}

Assistant:

long long SystemInformationImplementation::GetCyclesDifference(
  DELAY_FUNC DelayFunction, unsigned int uiParameter)
{
#if defined(_MSC_VER) && (_MSC_VER >= 1400)
  unsigned __int64 stamp1, stamp2;

#  ifdef _M_ARM64
  stamp1 = _ReadStatusReg(ARM64_PMCCNTR_EL0);
  DelayFunction(uiParameter);
  stamp2 = _ReadStatusReg(ARM64_PMCCNTR_EL0);
#  else
  stamp1 = __rdtsc();
  DelayFunction(uiParameter);
  stamp2 = __rdtsc();
#  endif

  return stamp2 - stamp1;
#elif USE_ASM_INSTRUCTIONS

  unsigned int edx1, eax1;
  unsigned int edx2, eax2;

  // Calculate the frequency of the CPU instructions.
  __try {
    _asm {
      push uiParameter ; push parameter param
      mov ebx, DelayFunction ; store func in ebx

      RDTSC_INSTRUCTION

      mov esi, eax ; esi = eax
      mov edi, edx ; edi = edx

      call ebx ; call the delay functions

      RDTSC_INSTRUCTION

      pop ebx

      mov edx2, edx      ; edx2 = edx
      mov eax2, eax      ; eax2 = eax

      mov edx1, edi      ; edx2 = edi
      mov eax1, esi      ; eax2 = esi
    }
  } __except (1) {
    return -1;
  }

  return ((((__int64)edx2 << 32) + eax2) - (((__int64)edx1 << 32) + eax1));

#else
  (void)DelayFunction;
  (void)uiParameter;
  return -1;
#endif
}